

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAux.h
# Opt level: O2

void __thiscall BamTools::RefData::RefData(RefData *this,RefData *param_1)

{
  std::__cxx11::string::string((string *)this,(string *)param_1);
  this->RefLength = param_1->RefLength;
  return;
}

Assistant:

struct API_EXPORT RefData
{

    std::string RefName;  //!< name of reference sequence
    int32_t RefLength;    //!< length of reference sequence

    //! constructor
    RefData(const std::string& name = std::string(), const int32_t& length = 0)
        : RefName(name)
        , RefLength(length)
    {}
}